

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int ZSTDMT_overlapLog_default(ZSTD_strategy strat)

{
  int local_c;
  ZSTD_strategy strat_local;
  
  switch(strat) {
  case ZSTD_fast:
  case ZSTD_dfast:
  case ZSTD_greedy:
  case ZSTD_lazy:
  default:
    local_c = 6;
    break;
  case ZSTD_lazy2:
  case ZSTD_btlazy2:
    local_c = 7;
    break;
  case ZSTD_btopt:
  case ZSTD_btultra:
    local_c = 8;
    break;
  case ZSTD_btultra2:
    local_c = 9;
  }
  return local_c;
}

Assistant:

static int ZSTDMT_overlapLog_default(ZSTD_strategy strat)
{
    switch(strat)
    {
        case ZSTD_btultra2:
            return 9;
        case ZSTD_btultra:
        case ZSTD_btopt:
            return 8;
        case ZSTD_btlazy2:
        case ZSTD_lazy2:
            return 7;
        case ZSTD_lazy:
        case ZSTD_greedy:
        case ZSTD_dfast:
        case ZSTD_fast:
        default:;
    }
    return 6;
}